

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O1

int find_symbol(Grammar *g,char *s,char *e,int kind)

{
  byte bVar1;
  Term *pTVar2;
  char *__s;
  int iVar3;
  ushort **ppuVar4;
  size_t sVar5;
  Production *pPVar6;
  Production *pPVar7;
  ulong uVar8;
  size_t __n;
  int local_34;
  
  bVar1 = *s;
  if (bVar1 != 0) {
    ppuVar4 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 0x20) == 0) break;
      bVar1 = s[1];
      s = s + 1;
    } while (bVar1 != 0);
  }
  if (s < e) {
    if (kind == 1) {
      pPVar6 = lookup_production(g,s,(int)e - (int)s);
      pPVar7 = pPVar6;
      if (pPVar6 != (Production *)0x0) {
        pPVar7 = (Production *)(ulong)pPVar6->index;
      }
      if (pPVar6 != (Production *)0x0) {
        return (int)pPVar7;
      }
    }
    else if (kind == 4) {
      if ((g->terminals).n == 0) {
        local_34 = -1;
      }
      else {
        __n = (long)e - (long)s;
        local_34 = -1;
        uVar8 = 0;
        do {
          pTVar2 = (g->terminals).v[uVar8];
          if (pTVar2->kind == TERM_STRING) {
            __s = pTVar2->term_name;
            if (__s == (char *)0x0) {
LAB_0013a050:
              if ((__n != (long)pTVar2->string_len) ||
                 (iVar3 = strncmp(s,pTVar2->string,__n), iVar3 != 0)) goto LAB_0013a013;
            }
            else {
              sVar5 = strlen(__s);
              if ((sVar5 != __n) || (iVar3 = strncmp(s,__s,__n), iVar3 != 0)) {
                if (__s != (char *)0x0) goto LAB_0013a013;
                goto LAB_0013a050;
              }
            }
            if (local_34 < 1) {
              local_34 = (int)uVar8;
            }
            else {
              d_fail("attempt to find symbol for non-unique string \'%s\'\n",pTVar2->string);
            }
          }
LAB_0013a013:
          uVar8 = uVar8 + 1;
        } while (uVar8 < (g->terminals).n);
      }
      if (0 < local_34) {
        return (g->productions).n + local_34;
      }
    }
  }
  return -1;
}

Assistant:

static int find_symbol(Grammar *g, char *s, char *e, int kind) {
  while (*s && isspace_(*s)) s++;
  if (e > s) {
    if (kind == D_SYMBOL_NTERM) {
      Production *p;
      if ((p = lookup_production(g, s, e - s))) return p->index;
    } else if (kind == D_SYMBOL_STRING) {
      uint i;
      int found = -1;
      for (i = 0; i < g->terminals.n; i++)
        if (g->terminals.v[i]->kind == TERM_STRING &&
            ((g->terminals.v[i]->term_name && strlen(g->terminals.v[i]->term_name) == (size_t)(e - s) &&
              !strncmp(s, g->terminals.v[i]->term_name, e - s)) ||
             (!g->terminals.v[i]->term_name && g->terminals.v[i]->string_len == (e - s) &&
              !strncmp(s, g->terminals.v[i]->string, e - s)))) {
          if (found > 0) {
            d_fail("attempt to find symbol for non-unique string '%s'\n", g->terminals.v[i]->string);
          } else
            found = i;
        }
      if (found > 0) return found + g->productions.n;
    }
  }
  return -1;
}